

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

void ParseVersion(string *version,int *major,int *minor)

{
  int iVar1;
  char *pcVar2;
  string local_70 [32];
  long local_50;
  size_t start;
  long local_28;
  size_t end;
  int *minor_local;
  int *major_local;
  string *version_local;
  
  end = (size_t)minor;
  minor_local = major;
  major_local = (int *)version;
  local_28 = std::__cxx11::string::find((char)version,0x2e);
  std::__cxx11::string::substr((ulong)&start,(ulong)major_local);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(pcVar2);
  *minor_local = iVar1;
  std::__cxx11::string::~string((string *)&start);
  *(undefined4 *)end = 0;
  if (local_28 != -1) {
    local_50 = local_28 + 1;
    local_28 = std::__cxx11::string::find((char)major_local,0x2e);
    std::__cxx11::string::substr((ulong)local_70,(ulong)major_local);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar2);
    *(int *)end = iVar1;
    std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void ParseVersion(const string& version, int* major, int* minor) {
  size_t end = version.find('.');
  *major = atoi(version.substr(0, end).c_str());
  *minor = 0;
  if (end != string::npos) {
    size_t start = end + 1;
    end = version.find('.', start);
    *minor = atoi(version.substr(start, end).c_str());
  }
}